

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

SmallBuffer * helics::ValueConverter<double>::convert(double *vals,size_t size)

{
  SmallBuffer *in_RDI;
  SmallBuffer *dv;
  SmallBuffer *size_00;
  double *in_stack_ffffffffffffffd0;
  
  size_00 = in_RDI;
  SmallBuffer::SmallBuffer(in_RDI);
  convert(in_stack_ffffffffffffffd0,(size_t)size_00,in_RDI);
  return in_RDI;
}

Assistant:

static SmallBuffer convert(const X* vals, size_t size)
    {
        auto dv = SmallBuffer();
        convert(vals, size, dv);
        return dv;
    }